

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

void __thiscall ThirdTag::ThirdTag(ThirdTag *this,tag_t<cfgfile::string_trait_t> *owner)

{
  undefined8 *in_RDI;
  undefined1 in_stack_ffffffffffffffbf;
  string_t *in_stack_ffffffffffffffc0;
  tag_t<cfgfile::string_trait_t> *in_stack_ffffffffffffffc8;
  tag_t<cfgfile::string_trait_t> *in_stack_ffffffffffffffd0;
  char *in_stack_ffffffffffffffd8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffe0;
  
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8,
             (allocator<char> *)in_stack_ffffffffffffffd0);
  cfgfile::tag_t<cfgfile::string_trait_t>::tag_t
            (in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc0,
             (bool)in_stack_ffffffffffffffbf);
  std::__cxx11::string::~string((string *)&stack0xffffffffffffffd0);
  std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffffcf);
  *in_RDI = &PTR__ThirdTag_001af538;
  *(undefined1 *)(in_RDI + 0xc) = 0;
  *(undefined1 *)((long)in_RDI + 0x61) = 0;
  *(undefined1 *)((long)in_RDI + 0x62) = 0;
  return;
}

Assistant:

explicit ThirdTag( tag_t<> & owner )
		:	cfgfile::tag_t<>( owner, "thirdTag", false )
		,	m_started( false )
		,	m_finished( false )
		,	m_withString( false )
	{
	}